

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O2

void testQuatSetRotation(void)

{
  double dVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  V3f from;
  Rand48 rand;
  V3f local_80;
  V3f local_70;
  Imath_3_2 local_60 [8];
  float local_58;
  float local_54;
  Rand48 local_4e;
  undefined1 local_48 [24];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing quaternion rotations");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"  exact 90-degree rotations");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_70.x = 1.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  local_80.x = 0.0;
  local_80.y = 1.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_80.z = 1.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 1.0;
  local_70.z = 0.0;
  local_80.x = 1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 1.0;
  local_70.z = 0.0;
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_80.z = 1.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 1.0;
  local_80.x = 1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 1.0;
  local_80.x = 0.0;
  local_80.y = 1.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"  exact zero-degree rotations");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_70.x = 1.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  local_80.x = 1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 1.0;
  local_70.z = 0.0;
  local_80.x = 0.0;
  local_80.y = 1.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 1.0;
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_80.z = 1.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 2.0;
  local_80.y = 4.0;
  local_80.z = 6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"  exact 180-degree rotations");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_70.x = 1.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  local_80.x = -1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 1.0;
  local_70.z = 0.0;
  local_80.x = 0.0;
  local_80.y = -1.0;
  local_80.z = 0.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 1.0;
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_80.z = -1.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -2.0;
  local_80.y = -4.0;
  local_80.z = -6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 3.0;
  local_70.z = 2.0;
  local_80.x = -2.0;
  local_80.y = -6.0;
  local_80.z = -4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 2.0;
  local_70.y = 1.0;
  local_70.z = 3.0;
  local_80.x = -4.0;
  local_80.y = -2.0;
  local_80.z = -6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 3.0;
  local_70.y = 1.0;
  local_70.z = 2.0;
  local_80.x = -6.0;
  local_80.y = -2.0;
  local_80.z = -4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 2.0;
  local_70.y = 3.0;
  local_70.z = 1.0;
  local_80.x = -4.0;
  local_80.y = -6.0;
  local_80.z = -2.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 3.0;
  local_70.y = 2.0;
  local_70.z = 1.0;
  local_80.x = -6.0;
  local_80.y = -4.0;
  local_80.z = -2.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"  other angles");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 4.0;
  local_80.y = 5.0;
  local_80.z = 6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 4.0;
  local_80.y = 6.0;
  local_80.z = 5.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 5.0;
  local_80.y = 4.0;
  local_80.z = 6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 6.0;
  local_80.y = 4.0;
  local_80.z = 5.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 5.0;
  local_80.y = 6.0;
  local_80.z = 4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = 6.0;
  local_80.y = 5.0;
  local_80.z = 4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -4.0;
  local_80.y = -5.0;
  local_80.z = -6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -4.0;
  local_80.y = -6.0;
  local_80.z = -5.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -5.0;
  local_80.y = -4.0;
  local_80.z = -6.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -6.0;
  local_80.y = -4.0;
  local_80.z = -5.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -5.0;
  local_80.y = -6.0;
  local_80.z = -4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  local_70.x = 1.0;
  local_70.y = 2.0;
  local_70.z = 3.0;
  local_80.x = -6.0;
  local_80.y = -5.0;
  local_80.z = -4.0;
  anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"  random from and to vectors");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_4e._state[0] = 0xf7af;
  local_4e._state[1] = 0xa5a6;
  local_4e._state[2] = 0xf7af;
  iVar3 = 500000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_80,&local_4e);
    dVar1 = Imath_3_2::Rand48::nextf(&local_4e,0.1,10.0);
    fVar5 = (float)dVar1;
    local_70.z = local_80.z * fVar5;
    local_70.y = fVar5 * local_80.y;
    local_70.x = fVar5 * local_80.x;
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(local_60,&local_4e);
    dVar1 = Imath_3_2::Rand48::nextf(&local_4e,0.1,10.0);
    fVar5 = (float)dVar1;
    local_80.z = local_58 * fVar5;
    local_80.y = fVar5 * local_60._4_4_;
    local_80.x = fVar5 * local_60._0_4_;
    anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  nearly equal from and to vectors");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_4e._state[0] = 0xcf65;
  local_4e._state[1] = 0x111d;
  local_4e._state[2] = 0xcf65;
  iVar3 = 500000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_70,&local_4e);
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(local_60,&local_4e);
    local_80.z = local_58 * 1.1920929e-05 + local_70.z;
    local_80.x = local_70.x + local_60._0_4_ * 1.1920929e-05;
    local_80.y = local_70.y + local_60._4_4_ * 1.1920929e-05;
    anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  nearly opposite from and to vectors");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_4e._state[0] = 0xcf65;
  local_4e._state[1] = 0x111d;
  local_4e._state[2] = 0xcf65;
  iVar3 = 500000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_70,&local_4e);
    local_54 = local_70.z;
    local_48._0_4_ = local_70.x;
    local_48._4_4_ = local_70.y;
    local_48._8_8_ = 0;
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(local_60,&local_4e);
    local_80.z = local_58 * 1.1920929e-05 - local_54;
    local_80.y = local_60._4_4_ * 1.1920929e-05 - (float)local_48._4_4_;
    local_80.x = local_60._0_4_ * 1.1920929e-05 - (float)local_48._0_4_;
    anon_unknown.dwarf_ccc73::testRotation(&local_70,&local_80);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testQuatSetRotation ()
{
    cout << "Testing quaternion rotations" << endl;

    specificVectors ();
    randomVectors ();
    nearlyEqualVectors ();
    nearlyOppositeVectors ();

    cout << "ok\n" << endl;
}